

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool __thiscall
google::protobuf::FieldDescriptorProto::MergePartialFromCodedStream
          (FieldDescriptorProto *this,CodedInputStream *input)

{
  uint tag_00;
  CodedInputStream *pCVar1;
  bool bVar2;
  int iVar3;
  WireType WVar4;
  pair<unsigned_int,_bool> pVar5;
  FieldOptions *value_00;
  string *psVar6;
  char *pcVar7;
  UnknownFieldSet *pUVar8;
  bool local_91;
  FieldDescriptorProto_Type local_7c;
  FieldDescriptorProto_Label local_78;
  int value_1;
  int value;
  pair<unsigned_int,_bool> p;
  uint32 tag;
  CodedInputStream *input_local;
  FieldDescriptorProto *this_local;
  bool local_3d;
  uint32 local_3c [2];
  uint32 tag_1;
  bool at_or_below_cutoff;
  uint32 tag_3;
  uint32 kMax2ByteVarint;
  undefined4 local_24;
  uint32 tag_2;
  uint32 kMax1ByteVarint;
  uint32 first_byte_or_zero;
  uint32 local_10;
  uint uStack_c;
  
  unique0x10000621 = input;
LAB_0051cacb:
  do {
    _first_byte_or_zero = stack0xffffffffffffff98;
    kMax1ByteVarint = 0x7f;
    tag_2 = 0;
    if ((stack0xffffffffffffff98->buffer_ < stack0xffffffffffffff98->buffer_end_) &&
       (tag_2 = (uint32)*stack0xffffffffffffff98->buffer_,
       '\0' < (char)*stack0xffffffffffffff98->buffer_)) {
      local_24 = 0x7f;
      kMax2ByteVarint = (uint32)*stack0xffffffffffffff98->buffer_;
      io::CodedInputStream::Advance(stack0xffffffffffffff98,1);
      local_91 = 0x7e < kMax1ByteVarint || kMax2ByteVarint <= kMax1ByteVarint;
      tag_3._3_1_ = local_91;
      pVar5 = std::make_pair<unsigned_int&,bool>(&kMax2ByteVarint,(bool *)((long)&tag_3 + 3));
      local_10 = pVar5.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar5.second);
    }
    else {
      local_3c[0] = io::CodedInputStream::ReadTagFallback(stack0xffffffffffffff98,tag_2);
      local_3d = local_3c[0] - 1 < kMax1ByteVarint;
      pVar5 = std::make_pair<unsigned_int_const&,bool>(local_3c,&local_3d);
      local_10 = pVar5.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar5.second);
    }
    value._0_1_ = (undefined1)uStack_c;
    value_1 = local_10;
    p.first = value_1;
    if ((uStack_c & 1) == 0) goto switchD_0051ccf7_default;
    iVar3 = internal::WireFormatLite::GetTagFieldNumber(local_10);
    pCVar1 = stack0xffffffffffffff98;
    switch(iVar3) {
    case 1:
      if ((p.first & 0xff) == 10) {
        psVar6 = mutable_name_abi_cxx11_(this);
        bVar2 = internal::WireFormatLite::ReadString(pCVar1,psVar6);
        if (!bVar2) {
          return false;
        }
        name_abi_cxx11_(this);
        pcVar7 = (char *)std::__cxx11::string::data();
        name_abi_cxx11_(this);
        iVar3 = std::__cxx11::string::length();
        internal::WireFormat::VerifyUTF8StringNamedField
                  (pcVar7,iVar3,PARSE,"google.protobuf.FieldDescriptorProto.name");
        goto LAB_0051cacb;
      }
      break;
    case 2:
      if ((p.first & 0xff) == 0x12) {
        psVar6 = mutable_extendee_abi_cxx11_(this);
        bVar2 = internal::WireFormatLite::ReadString(pCVar1,psVar6);
        if (!bVar2) {
          return false;
        }
        extendee_abi_cxx11_(this);
        pcVar7 = (char *)std::__cxx11::string::data();
        extendee_abi_cxx11_(this);
        iVar3 = std::__cxx11::string::length();
        internal::WireFormat::VerifyUTF8StringNamedField
                  (pcVar7,iVar3,PARSE,"google.protobuf.FieldDescriptorProto.extendee");
        goto LAB_0051cacb;
      }
      break;
    case 3:
      if ((p.first & 0xff) != 0x18) break;
      set_has_number(this);
      bVar2 = internal::WireFormatLite::
              ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                        (stack0xffffffffffffff98,&this->number_);
      goto joined_r0x0051d093;
    case 4:
      if ((p.first & 0xff) == 0x20) {
        bVar2 = internal::WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                          (stack0xffffffffffffff98,(int *)&local_78);
        if (!bVar2) {
          return false;
        }
        bVar2 = FieldDescriptorProto_Label_IsValid(local_78);
        if (bVar2) {
          set_label(this,local_78);
        }
        else {
          pUVar8 = mutable_unknown_fields(this);
          UnknownFieldSet::AddVarint(pUVar8,4,(long)(int)local_78);
        }
        goto LAB_0051cacb;
      }
      break;
    case 5:
      if ((p.first & 0xff) == 0x28) {
        bVar2 = internal::WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                          (stack0xffffffffffffff98,(int *)&local_7c);
        if (!bVar2) {
          return false;
        }
        bVar2 = FieldDescriptorProto_Type_IsValid(local_7c);
        if (bVar2) {
          set_type(this,local_7c);
        }
        else {
          pUVar8 = mutable_unknown_fields(this);
          UnknownFieldSet::AddVarint(pUVar8,5,(long)(int)local_7c);
        }
        goto LAB_0051cacb;
      }
      break;
    case 6:
      if ((p.first & 0xff) == 0x32) {
        psVar6 = mutable_type_name_abi_cxx11_(this);
        bVar2 = internal::WireFormatLite::ReadString(pCVar1,psVar6);
        if (!bVar2) {
          return false;
        }
        type_name_abi_cxx11_(this);
        pcVar7 = (char *)std::__cxx11::string::data();
        type_name_abi_cxx11_(this);
        iVar3 = std::__cxx11::string::length();
        internal::WireFormat::VerifyUTF8StringNamedField
                  (pcVar7,iVar3,PARSE,"google.protobuf.FieldDescriptorProto.type_name");
        goto LAB_0051cacb;
      }
      break;
    case 7:
      if ((p.first & 0xff) == 0x3a) {
        psVar6 = mutable_default_value_abi_cxx11_(this);
        bVar2 = internal::WireFormatLite::ReadString(pCVar1,psVar6);
        if (!bVar2) {
          return false;
        }
        default_value_abi_cxx11_(this);
        pcVar7 = (char *)std::__cxx11::string::data();
        default_value_abi_cxx11_(this);
        iVar3 = std::__cxx11::string::length();
        internal::WireFormat::VerifyUTF8StringNamedField
                  (pcVar7,iVar3,PARSE,"google.protobuf.FieldDescriptorProto.default_value");
        goto LAB_0051cacb;
      }
      break;
    case 8:
      if ((p.first & 0xff) == 0x42) {
        value_00 = mutable_options(this);
        bVar2 = internal::WireFormatLite::ReadMessageNoVirtual<google::protobuf::FieldOptions>
                          (pCVar1,value_00);
        goto joined_r0x0051d093;
      }
      break;
    case 9:
      if ((p.first & 0xff) == 0x48) {
        set_has_oneof_index(this);
        bVar2 = internal::WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                          (stack0xffffffffffffff98,&this->oneof_index_);
        goto joined_r0x0051d093;
      }
      break;
    case 10:
      if ((p.first & 0xff) == 0x52) {
        psVar6 = mutable_json_name_abi_cxx11_(this);
        bVar2 = internal::WireFormatLite::ReadString(pCVar1,psVar6);
        if (!bVar2) {
          return false;
        }
        json_name_abi_cxx11_(this);
        pcVar7 = (char *)std::__cxx11::string::data();
        json_name_abi_cxx11_(this);
        iVar3 = std::__cxx11::string::length();
        internal::WireFormat::VerifyUTF8StringNamedField
                  (pcVar7,iVar3,PARSE,"google.protobuf.FieldDescriptorProto.json_name");
        goto LAB_0051cacb;
      }
    }
switchD_0051ccf7_default:
    if ((p.first == 0) ||
       (WVar4 = internal::WireFormatLite::GetTagWireType(p.first), pCVar1 = stack0xffffffffffffff98,
       tag_00 = p.first, WVar4 == WIRETYPE_END_GROUP)) {
      return true;
    }
    pUVar8 = mutable_unknown_fields(this);
    bVar2 = internal::WireFormat::SkipField(pCVar1,tag_00,pUVar8);
joined_r0x0051d093:
    if (!bVar2) {
      return false;
    }
  } while( true );
}

Assistant:

bool FieldDescriptorProto::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.FieldDescriptorProto)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FieldDescriptorProto.name");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string extendee = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_extendee()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->extendee().data(), this->extendee().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FieldDescriptorProto.extendee");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int32 number = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          set_has_number();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &number_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .google.protobuf.FieldDescriptorProto.Label label = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(32u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::google::protobuf::FieldDescriptorProto_Label_IsValid(value)) {
            set_label(static_cast< ::google::protobuf::FieldDescriptorProto_Label >(value));
          } else {
            mutable_unknown_fields()->AddVarint(4, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .google.protobuf.FieldDescriptorProto.Type type = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(40u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::google::protobuf::FieldDescriptorProto_Type_IsValid(value)) {
            set_type(static_cast< ::google::protobuf::FieldDescriptorProto_Type >(value));
          } else {
            mutable_unknown_fields()->AddVarint(5, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string type_name = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(50u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_type_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->type_name().data(), this->type_name().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FieldDescriptorProto.type_name");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string default_value = 7;
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(58u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_default_value()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->default_value().data(), this->default_value().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FieldDescriptorProto.default_value");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .google.protobuf.FieldOptions options = 8;
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(66u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_options()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int32 oneof_index = 9;
      case 9: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(72u)) {
          set_has_oneof_index();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &oneof_index_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string json_name = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_json_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->json_name().data(), this->json_name().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FieldDescriptorProto.json_name");
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.FieldDescriptorProto)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.FieldDescriptorProto)
  return false;
#undef DO_
}